

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnrichableSpiAnalyzerSettings.cpp
# Opt level: O0

void __thiscall
EnrichableSpiAnalyzerSettings::UpdateInterfacesFromSettings(EnrichableSpiAnalyzerSettings *this)

{
  element_type *peVar1;
  element_type *peVar2;
  EnrichableSpiAnalyzerSettings *this_local;
  
  peVar1 = std::auto_ptr<AnalyzerSettingInterfaceChannel>::operator->(&this->mMosiChannelInterface);
  AnalyzerSettingInterfaceChannel::SetChannel((Channel *)peVar1);
  peVar1 = std::auto_ptr<AnalyzerSettingInterfaceChannel>::operator->(&this->mMisoChannelInterface);
  AnalyzerSettingInterfaceChannel::SetChannel((Channel *)peVar1);
  peVar1 = std::auto_ptr<AnalyzerSettingInterfaceChannel>::operator->(&this->mClockChannelInterface)
  ;
  AnalyzerSettingInterfaceChannel::SetChannel((Channel *)peVar1);
  peVar1 = std::auto_ptr<AnalyzerSettingInterfaceChannel>::operator->
                     (&this->mEnableChannelInterface);
  AnalyzerSettingInterfaceChannel::SetChannel((Channel *)peVar1);
  std::auto_ptr<AnalyzerSettingInterfaceNumberList>::operator->(&this->mShiftOrderInterface);
  AnalyzerSettingInterfaceNumberList::SetNumber((double)this->mShiftOrder);
  std::auto_ptr<AnalyzerSettingInterfaceNumberList>::operator->(&this->mBitsPerTransferInterface);
  AnalyzerSettingInterfaceNumberList::SetNumber((double)this->mBitsPerTransfer);
  std::auto_ptr<AnalyzerSettingInterfaceNumberList>::operator->(&this->mClockInactiveStateInterface)
  ;
  AnalyzerSettingInterfaceNumberList::SetNumber((double)this->mClockInactiveState);
  std::auto_ptr<AnalyzerSettingInterfaceNumberList>::operator->(&this->mDataValidEdgeInterface);
  AnalyzerSettingInterfaceNumberList::SetNumber((double)this->mDataValidEdge);
  std::auto_ptr<AnalyzerSettingInterfaceNumberList>::operator->(&this->mEnableActiveStateInterface);
  AnalyzerSettingInterfaceNumberList::SetNumber((double)this->mEnableActiveState);
  peVar2 = std::auto_ptr<AnalyzerSettingInterfaceText>::operator->(&this->mParserCommandInterface);
  AnalyzerSettingInterfaceText::SetText((char *)peVar2);
  return;
}

Assistant:

void EnrichableSpiAnalyzerSettings::UpdateInterfacesFromSettings()
{
	mMosiChannelInterface->SetChannel( mMosiChannel );
	mMisoChannelInterface->SetChannel( mMisoChannel );
	mClockChannelInterface->SetChannel( mClockChannel );
	mEnableChannelInterface->SetChannel( mEnableChannel );
	mShiftOrderInterface->SetNumber( mShiftOrder );
	mBitsPerTransferInterface->SetNumber( mBitsPerTransfer );
	mClockInactiveStateInterface->SetNumber( mClockInactiveState );
	mDataValidEdgeInterface->SetNumber( mDataValidEdge );
	mEnableActiveStateInterface->SetNumber( mEnableActiveState );
	mParserCommandInterface->SetText( mParserCommand );
}